

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::debugging_internal::ParseUnnamedTypeName(State *state)

{
  ParseState *pPVar1;
  undefined1 *puVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  char *str;
  int which;
  int local_3c;
  undefined8 local_38;
  int local_30;
  
  iVar3 = state->recursion_depth;
  iVar4 = state->steps;
  state->recursion_depth = iVar3 + 1;
  state->steps = iVar4 + 1;
  if (iVar4 < 0x20000 && iVar3 < 0x100) {
    local_30 = (state->parse_state).prev_name_idx;
    local_38._0_4_ = (state->parse_state).mangled_idx;
    local_38._4_4_ = (state->parse_state).out_cur_idx;
    uVar5 = *(uint *)&(state->parse_state).field_0xc;
    local_3c = -1;
    bVar6 = ParseTwoCharToken(state,"Ut");
    if (bVar6) {
      ParseNumber(state,&local_3c);
      if (0x7ffffffd < local_3c) goto LAB_00277b96;
      bVar6 = ParseOneCharToken(state,'_');
      if (!bVar6) goto LAB_00277b96;
      str = "{unnamed type#";
LAB_00277b69:
      MaybeAppend(state,str);
      MaybeAppendDecimal(state,local_3c + 2);
      MaybeAppend(state,"}");
      bVar6 = true;
      goto LAB_00277c72;
    }
LAB_00277b96:
    pPVar1 = &state->parse_state;
    (state->parse_state).prev_name_idx = local_30;
    pPVar1->mangled_idx = (undefined4)local_38;
    pPVar1->out_cur_idx = local_38._4_4_;
    *(uint *)&(state->parse_state).field_0xc = uVar5;
    local_3c = -1;
    bVar6 = ParseTwoCharToken(state,"Ul");
    if (bVar6) {
      puVar2 = &(state->parse_state).field_0xf;
      *puVar2 = *puVar2 & 0x7f;
      do {
        bVar6 = ParseTemplateParamDecl(state);
      } while (bVar6);
      bVar6 = ParseType(state);
      if (bVar6) {
        do {
          bVar7 = ParseType(state);
        } while (bVar7);
        if (bVar6) {
          *(uint *)&(state->parse_state).field_0xc =
               *(uint *)&(state->parse_state).field_0xc & 0x7fffffff | uVar5 & 0x80000000;
          bVar6 = ParseOneCharToken(state,'E');
          if (bVar6) {
            ParseNumber(state,&local_3c);
            if (local_3c < 0x7ffffffe) {
              bVar6 = ParseOneCharToken(state,'_');
              if (bVar6) {
                str = "{lambda()#";
                goto LAB_00277b69;
              }
            }
          }
        }
      }
    }
    (state->parse_state).prev_name_idx = local_30;
    pPVar1->mangled_idx = (undefined4)local_38;
    pPVar1->out_cur_idx = local_38._4_4_;
    *(uint *)&(state->parse_state).field_0xc = uVar5;
  }
  bVar6 = false;
LAB_00277c72:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar6;
}

Assistant:

static bool ParseUnnamedTypeName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  // Type's 1-based index n is encoded as { "", n == 1; itoa(n-2), otherwise }.
  // Optionally parse the encoded value into 'which' and add 2 to get the index.
  int which = -1;

  // Unnamed type local to function or class.
  if (ParseTwoCharToken(state, "Ut") && Optional(ParseNumber(state, &which)) &&
      which <= std::numeric_limits<int>::max() - 2 &&  // Don't overflow.
      ParseOneCharToken(state, '_')) {
    MaybeAppend(state, "{unnamed type#");
    MaybeAppendDecimal(state, 2 + which);
    MaybeAppend(state, "}");
    return true;
  }
  state->parse_state = copy;

  // Closure type.
  which = -1;
  if (ParseTwoCharToken(state, "Ul") && DisableAppend(state) &&
      ZeroOrMore(ParseTemplateParamDecl, state) &&
      OneOrMore(ParseType, state) && RestoreAppend(state, copy.append) &&
      ParseOneCharToken(state, 'E') && Optional(ParseNumber(state, &which)) &&
      which <= std::numeric_limits<int>::max() - 2 &&  // Don't overflow.
      ParseOneCharToken(state, '_')) {
    MaybeAppend(state, "{lambda()#");
    MaybeAppendDecimal(state, 2 + which);
    MaybeAppend(state, "}");
    return true;
  }
  state->parse_state = copy;

  return false;
}